

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::Option::Option
          (Option *this,char *name_,char *desc_,char *cate_,char *type_,bool tunable,
          Option *dependOn)

{
  vec<Minisat::Option_*> *this_00;
  Option *local_10;
  
  this->_vptr_Option = (_func_int **)&PTR__Option_00138a90;
  this->name = name_;
  this->description = desc_;
  this->category = cate_;
  this->type_name = type_;
  this->dependOnNonDefaultOf = dependOn;
  this_00 = getOptionList();
  local_10 = this;
  vec<Minisat::Option_*>::push(this_00,&local_10);
  return;
}

Assistant:

Option(const char *name_,
           const char *desc_,
           const char *cate_,
           const char *type_,
           bool tunable = false,
           Option *dependOn = 0)
      : // push to this list, if present!
      name(name_)
      , description(desc_)
      , category(cate_)
      , type_name(type_)
      , dependOnNonDefaultOf(dependOn)
    {
        getOptionList().push(this);
    }